

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVStream.h
# Opt level: O0

unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
cmUVStreamRead<cmExecuteProcessCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__1,cmExecuteProcessCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__2>
          (uv_stream_t *stream,anon_class_32_4_472b389b onRead,anon_class_8_1_51835e09 onFinish)

{
  uv_stream_t *stream_00;
  pointer pcVar1;
  _func_void_uv_handle_t_ptr_size_t_uv_buf_t_ptr *alloc_cb;
  _func_void_uv_stream_t_ptr_ssize_t_uv_buf_t_ptr *read_cb;
  _lambda_uv_stream_s__long_uv_buf_t_const___1_ local_36;
  _lambda_uv_handle_s__unsigned_long_uv_buf_t___1_ local_35 [20];
  undefined1 local_21;
  uv_stream_t *local_20;
  uv_stream_t *stream_local;
  anon_class_8_1_51835e09 onFinish_local;
  __single_object *handle;
  
  local_21 = 0;
  local_20 = (uv_stream_t *)onFinish.outputData;
  onFinish_local.outputData = (ReadData *)stream;
  std::make_unique<cmUVStreamReadHandle>();
  pcVar1 = std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::
           operator->((unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                       *)stream);
  std::function<void(std::vector<char,std::allocator<char>>)>::operator=
            ((function<void(std::vector<char,std::allocator<char>>)> *)&pcVar1->OnRead,&onRead);
  pcVar1 = std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::
           operator->((unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                       *)stream);
  std::function<void()>::operator=
            ((function<void()> *)&pcVar1->OnFinish,(anon_class_8_1_51835e09 *)&stream_local);
  pcVar1 = std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::get
                     ((unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                       *)stream);
  stream_00 = local_20;
  local_20->data = pcVar1;
  alloc_cb = cmUVStreamRead(uv_stream_s*,cmExecuteProcessCommand(std::vector_const&,cmExecutionStatus&)::$_1,cmExecuteProcessCommand(std::vector_const&,cmExecutionStatus&)::$_2)
             ::{lambda(uv_handle_s*,unsigned_long,uv_buf_t*)#1}::operator_cast_to_function_pointer
                       (local_35);
  read_cb = cmUVStreamRead(uv_stream_s*,cmExecuteProcessCommand(std::vector_const&,cmExecutionStatus&)::$_1,cmExecuteProcessCommand(std::vector_const&,cmExecutionStatus&)::$_2)
            ::{lambda(uv_stream_s*,long,uv_buf_t_const*)#1}::operator_cast_to_function_pointer
                      (&local_36);
  uv_read_start(stream_00,alloc_cb,read_cb);
  return (__uniq_ptr_data<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>,_true,_true>
          )(__uniq_ptr_data<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>,_true,_true>
            )stream;
}

Assistant:

std::unique_ptr<cmUVStreamReadHandle> cmUVStreamRead(uv_stream_t* stream,
                                                     ReadCallback onRead,
                                                     FinishCallback onFinish)
{
  auto handle = cm::make_unique<cmUVStreamReadHandle>();
  handle->OnRead = std::move(onRead);
  handle->OnFinish = std::move(onFinish);

  stream->data = handle.get();
  uv_read_start(
    stream,
    [](uv_handle_t* s, std::size_t suggestedSize, uv_buf_t* buffer) {
      auto* data = static_cast<cmUVStreamReadHandle*>(s->data);
      data->Buffer.resize(suggestedSize);
      buffer->base = data->Buffer.data();
      buffer->len = suggestedSize;
    },
    [](uv_stream_t* s, ssize_t nread, const uv_buf_t* buffer) {
      auto* data = static_cast<cmUVStreamReadHandle*>(s->data);
      if (nread > 0) {
        (void)buffer;
        assert(buffer->base == data->Buffer.data());
        data->Buffer.resize(nread);
        data->OnRead(std::move(data->Buffer));
      } else if (nread < 0 /*|| nread == UV_EOF*/) {
        data->OnFinish();
        uv_read_stop(s);
      }
    });

  return handle;
}